

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O0

void anon_unknown.dwarf_11d458::testFile1(char *fileName,bool isImfFile)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  byte in_SIL;
  char *pcVar4;
  char *in_RDI;
  bool bVar5;
  char bytes [4];
  ifstream f;
  char *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  char local_228 [16];
  long local_218 [65];
  byte local_9;
  
  local_9 = in_SIL & 1;
  poVar3 = std::operator<<((ostream *)&std::cout,in_RDI);
  poVar3 = std::operator<<(poVar3," ");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_218);
  std::operator|(_S_in,_S_bin);
  testutil::OpenStreamWithUTF8Name<std::ifstream>
            ((basic_ifstream<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8
             ,~(_S_ios_openmode_min|_S_ios_openmode_max));
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!!f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMagic.cpp"
                  ,0x43,"void (anonymous namespace)::testFile1(const char *, bool)");
  }
  std::istream::read((char *)local_218,(long)local_228);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  bVar5 = false;
  if ((bVar1 & 1) == 0) {
    bVar5 = (bool)(local_9 & 1);
    bVar2 = Imf_2_5::isImfMagic(local_228);
    bVar5 = bVar5 == bVar2;
  }
  if (!bVar5) {
    __assert_fail("!!f && isImfFile == isImfMagic (bytes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMagic.cpp"
                  ,0x48,"void (anonymous namespace)::testFile1(const char *, bool)");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"is ");
  bVar5 = Imf_2_5::isImfMagic(local_228);
  pcVar4 = "not ";
  if (bVar5) {
    pcVar4 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,"an OpenEXR file\n");
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void
testFile1 (const char fileName[], bool isImfFile)
{
    cout << fileName << " " << flush;

    ifstream f;
    testutil::OpenStreamWithUTF8Name (f, fileName, ios::in | ios_base::binary);
    assert (!!f);

    char bytes[4];
    f.read (bytes, sizeof (bytes));

    assert (!!f && isImfFile == isImfMagic (bytes));

    cout << "is " << (isImfMagic (bytes)? "": "not ") << "an OpenEXR file\n";
}